

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem singlestep(lua_State *L)

{
  global_State *g_00;
  int iVar1;
  int n;
  lu_mem work;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  switch(g_00->gcstate) {
  case '\0':
    g_00->GCmemtrav = 0;
    propagatemark(g_00);
    if (g_00->gray == (GCObject *)0x0) {
      g_00->gcstate = '\x01';
    }
    L_local = (lua_State *)g_00->GCmemtrav;
    break;
  case '\x01':
    propagateall(g_00);
    L_local = (lua_State *)atomic(L);
    entersweep(L);
    g_00->GCestimate = g_00->totalbytes + g_00->GCdebt;
    break;
  case '\x02':
    L_local = (lua_State *)sweepstep(L,g_00,3,&g_00->finobj);
    break;
  case '\x03':
    L_local = (lua_State *)sweepstep(L,g_00,4,&g_00->tobefnz);
    break;
  case '\x04':
    L_local = (lua_State *)sweepstep(L,g_00,5,(GCObject **)0x0);
    break;
  case '\x05':
    g_00->mainthread->marked = g_00->mainthread->marked & 0xf8 | g_00->currentwhite & 3;
    checkSizes(L,g_00);
    g_00->gcstate = '\x06';
    L_local = (lua_State *)0x0;
    break;
  case '\x06':
    if ((g_00->tobefnz == (GCObject *)0x0) || (g_00->gckind == '\x01')) {
      g_00->gcstate = '\a';
      L_local = (lua_State *)0x0;
    }
    else {
      iVar1 = runafewfinalizers(L);
      L_local = (lua_State *)((long)iVar1 * 7);
    }
    break;
  case '\a':
    g_00->GCmemtrav = (long)(g_00->strt).size << 3;
    restartcollection(g_00);
    g_00->gcstate = '\0';
    L_local = (lua_State *)g_00->GCmemtrav;
    break;
  default:
    L_local = (lua_State *)0x0;
  }
  return (lu_mem)L_local;
}

Assistant:

static lu_mem singlestep(lua_State *L) {
    global_State *g = G(L);
    switch (g->gcstate) {
        case GCSpause: {
            g->GCmemtrav = g->strt.size * sizeof(GCObject *);
            restartcollection(g);
            g->gcstate = GCSpropagate;
            return g->GCmemtrav;
        }
        case GCSpropagate: {
            g->GCmemtrav = 0;
            lua_assert(g->gray);
            propagatemark(g);
            if (g->gray == NULL)  /* no more gray objects? */
                g->gcstate = GCSatomic;  /* finish propagate phase */
            return g->GCmemtrav;  /* memory traversed in this step */
        }
        case GCSatomic: {
            lu_mem work;
            propagateall(g);  /* make sure gray list is empty */
            work = atomic(L);  /* work is what was traversed by 'atomic' */
            entersweep(L);
            g->GCestimate = gettotalbytes(g);  /* first estimate */;
            return work;
        }
        case GCSswpallgc: {  /* sweep "regular" objects */
            return sweepstep(L, g, GCSswpfinobj, &g->finobj);
        }
        case GCSswpfinobj: {  /* sweep objects with finalizers */
            return sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
        }
        case GCSswptobefnz: {  /* sweep objects to be finalized */
            return sweepstep(L, g, GCSswpend, NULL);
        }
        case GCSswpend: {  /* finish sweeps */
            makewhite(g, g->mainthread);  /* sweep main thread */
            checkSizes(L, g);
            g->gcstate = GCScallfin;
            return 0;
        }
        case GCScallfin: {  /* call remaining finalizers */
            if (g->tobefnz && g->gckind != KGC_EMERGENCY) {
                int n = runafewfinalizers(L);
                return (n * GCFINALIZECOST);
            } else {  /* emergency mode or no more finalizers */
                g->gcstate = GCSpause;  /* finish collection */
                return 0;
            }
        }
        default:
            lua_assert(0);
            return 0;
    }
}